

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

void Acb_NtkUpdateNode(Acb_Ntk_t *p,int Pivot,word uTruth,Vec_Int_t *vSupp)

{
  Vec_Int_t *vTfo;
  
  Acb_NtkSaveSupport(p,Pivot);
  Acb_NtkResetNode(p,Pivot,uTruth,vSupp);
  Acb_ObjComputeLevelD(p,Pivot);
  if (p->vQue == (Vec_Que_t *)0x0) {
    vTfo = Acb_ObjCollectTfo(p,Pivot,1);
    Acb_NtkComputeLevelD(p,vTfo);
  }
  else {
    Acb_NtkUpdateTiming(p,-1);
  }
  (p->vSuppOld).nSize = 0;
  return;
}

Assistant:

void Acb_NtkUpdateNode( Acb_Ntk_t * p, int Pivot, word uTruth, Vec_Int_t * vSupp )
{
    //int Level = Acb_ObjLevelD(p, Pivot);
    Acb_NtkSaveSupport( p, Pivot );
    //Acb_NtkPrintNode( p, Pivot );
    Acb_NtkResetNode( p, Pivot, uTruth, vSupp );
    Acb_ObjComputeLevelD( p, Pivot );
    //assert( Level > Acb_ObjLevelD(p, Pivot) );
    //Acb_NtkPrintNode( p, Pivot );
    if ( p->vQue == NULL )
        Acb_NtkUpdateLevelD( p, Pivot );
    else
//        Acb_NtkUpdateTiming( p, Pivot );
        Acb_NtkUpdateTiming( p, -1 );
    Vec_IntClear( &p->vSuppOld );
}